

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.cpp
# Opt level: O2

size_t __thiscall
OpenSSLWrapper::SslConnection::SslRead
          (SslConnection *this,uint8_t *szBuffer,size_t nBufLen,int *iErrorHint)

{
  mutex *__mutex;
  int iVar1;
  int *piVar2;
  ulong uVar3;
  runtime_error *this_00;
  size_t nRead;
  
  if (this->m_ssl == (SSL *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Not Initialized");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __mutex = &this->m_mxSsl;
  std::mutex::lock(__mutex);
  ERR_clear_error();
  iVar1 = SSL_read_ex(this->m_ssl,szBuffer,nBufLen);
  if (iVar1 < 1) {
    iVar1 = SSL_get_error((SSL *)this->m_ssl,iVar1);
    if (iErrorHint != (int *)0x0) {
      *iErrorHint = iVar1;
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    switch(iVar1) {
    case 2:
      *(byte *)&this->m_iWantState = (byte)this->m_iWantState | 1;
      break;
    case 3:
      *(byte *)&this->m_iWantState = (byte)this->m_iWantState | 2;
      break;
    case 5:
      piVar2 = __errno_location();
      if ((*piVar2 == 0) && (uVar3 = ERR_peek_error(), uVar3 == 0)) {
        return 0;
      }
    default:
      this->m_iShutDownFlag = 1;
      if ((this->m_fError).super__Function_base._M_manager != (_Manager_type)0x0) {
        std::function<void_()>::operator()(&this->m_fError);
      }
      break;
    case 6:
      this->m_bZeroReceived = true;
      ShutDownConnection(this,iErrorHint);
    }
  }
  else {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  return 0;
}

Assistant:

size_t SslConnection::SslRead(uint8_t* szBuffer, size_t nBufLen, int* iErrorHint/* = nullptr*/)
    {
        if (nullptr == m_ssl)
            throw runtime_error("Not Initialized");

        //OSSL_HANDSHAKE_STATE hsState = SSL_get_state(m_ssl);
        //if (hsState != TLS_ST_OK)
        //    OutputDebugString(wstring(L"SSL invalid state: " + to_wstring(hsState) + L" on ssl context: " + to_wstring(reinterpret_cast<size_t>(m_ssl)) + L"\r\n").c_str());

        m_mxSsl.lock();

        ERR_clear_error();
        size_t nRead = 0;
        int iResult = SSL_read_ex(m_ssl, szBuffer, nBufLen, &nRead);
        if (iResult <= 0)
        {
            iResult = SSL_get_error(m_ssl, iResult);
            if (iErrorHint != nullptr)
                *iErrorHint = iResult;
            m_mxSsl.unlock();

            switch (iResult)
            {
            case SSL_ERROR_WANT_READ:
                m_iWantState |= 1; break;
            case SSL_ERROR_WANT_WRITE:
                m_iWantState |= 2; break;
            case SSL_ERROR_ZERO_RETURN:
                m_bZeroReceived = true;
                ShutDownConnection(iErrorHint);
                break;
            case SSL_ERROR_SYSCALL:
                iResult = errno;
                if (iResult == 0 && ERR_peek_error() == 0)    // if errno and ERR_peack_error are both 0, we not having really an error, and give it a other shoot
                    break;
                [[fallthrough]];
            default:
                m_iShutDownFlag = 1;
                if (m_fError)
                    m_fError();
            }

            return 0;
        }
        m_mxSsl.unlock();

        return nRead;
    }